

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.h
# Opt level: O2

void __thiscall
ON_SubDComponentId::ON_SubDComponentId(ON_SubDComponentId *this,ON_SubDVertexPtr vptr)

{
  this->m_id = 0;
  this->m_type_and_dir = '\0';
  this->m_valueAB[0] = '\0';
  this->m_valueAB[1] = '\0';
  this->m_valueAB[2] = '\0';
  if ((vptr.m_ptr & 0xfffffffffffffff8) != 0) {
    this->m_id = *(uint *)((vptr.m_ptr & 0xfffffffffffffff8) + 8);
    this->m_type_and_dir = (byte)vptr.m_ptr & 1 | 2;
  }
  return;
}

Assistant:

class ON_CLASS ON_SubDToBrepParameters
{
public:
  ON_SubDToBrepParameters() = default;
  ~ON_SubDToBrepParameters() = default;
  ON_SubDToBrepParameters(const ON_SubDToBrepParameters&) = default;
  ON_SubDToBrepParameters& operator=(const ON_SubDToBrepParameters&) = default;

  /*
  Description:
    Default ON_SubDToBrepParameters settings.
  Remarks: 
    These are the settings used by ON_SubD::BrepForm()
  */
  static const ON_SubDToBrepParameters Default;

  /*
  Description:
    Default ON_SubDToBrepParameters settings for creating an unpacked brep.
  */
  static const ON_SubDToBrepParameters DefaultUnpacked;

  /*
  Description:
    Default ON_SubDToBrepParameters settings for creating an packed brep.
  */
  static const ON_SubDToBrepParameters DefaultPacked;

  static int Compare(
    const ON_SubDToBrepParameters& lhs,
    const ON_SubDToBrepParameters& rhs
    );
  static int CompareFromPointers(
    const ON_SubDToBrepParameters* lhs,
    const ON_SubDToBrepParameters* rhs
    );

#pragma region RH_C_SHARED_ENUM [ON_SubDToBrepParameters::VertexProcess] [Rhino.Geometry.SubDToBrepOptions.ExtraordinaryVertexProcessOption] [nested:byte]
  /// <summary>
  /// ON_SubDToBrepParameters::Vertex identifies the options for post processing extraorindary vertices.
  /// </summary>
  enum class VertexProcess : unsigned char
  {
    ///<summary>
    /// The NURBS patches are used as is. 
    /// At extraordinary vertices, the brep vertex may not be G1.
    /// Typically the deviation bewtween the brep and SubD surface is smallest with this option.
    ///</summary>
    None = 0,

    ///<summary>
    /// At extraordinary vertices, the NURBS patches are modified so they are G1 at the extraordinary vertex.
    /// Typically the deviation bewtween the brep and SubD surface is larger than None and smaller than
    /// LocalG1x and LocalG2.
    ///</summary>
    LocalG1 = 1,

    ///<summary>
    /// At extraordinary vertices, the NURBS patches are modified so they are G2 at the extraordinary vertex.
    /// Typically the deviation bewtween the brep and SubD surface is larger than LocalG1 and LocalG1x.
    ///</summary>
    LocalG2 = 2,

    ///<summary>
    /// At extraordinary vertices, the NURBS patches are modified so they are G1 at the extraordinary vertex
    /// and tend to be closer to G1 along edges near the extraordinary vertex.
    /// Typically the deviation bewtween the brep and SubD surface is larger than LocalG1 and smaller than LocalG2.
    ///</summary>
    LocalG1x = 3,

    ///<summary>
    /// At extraordinary vertices, the NURBS patches are modified so they are G1 at the extraordinary vertex
    /// and G1 along edges near the extraordinary vertex.
    /// The patches will have one double knot near the extraordinary vertex.
    ///</summary>
    LocalG1xx = 4,
  };
#pragma endregion

  static ON_SubDToBrepParameters::VertexProcess VertexProcessFromUnsigned(
    unsigned int vertex_process_as_unsigned
  );

  static const ON_wString VertexProcessToString(
    ON_SubDToBrepParameters::VertexProcess vertex_process
  );

  /*
  Returns:
    Option used for post processing extraorindary vertices.
  */
  ON_SubDToBrepParameters::VertexProcess ExtraordinaryVertexProcess() const;

  /*
  Description:
    Set the ExtraordinaryVertexProcess() property.
  Parameters:
    ev_process - [in]
  */
  void SetExtraordinaryVertexProcess(
    ON_SubDToBrepParameters::VertexProcess ev_process
  );

  /*
  Returns:
    If true, then quad packs of SubD faces are returned as a single brep face.
    Otherwise each SubD face generates a brep face.
  Remarks:
    SubD n-gons with n != 4 always generate n brep faces.
  */
  bool PackFaces() const;

  /*
  Description:
    Set the PackFaces() property.
  Parameters:
    bPackFaces - [in]
  */
  void SetPackFaces(
    bool bPackFaces
  );

  const ON_wString ToString(
  bool bVerbose
  ) const;

  bool Read(ON_BinaryArchive& archive);
  
  bool Write(ON_BinaryArchive& archive) const;

private:
  bool m_bPackFaces = false;
  ON_SubDToBrepParameters::VertexProcess m_extraordinary_vertex_process = ON_SubDToBrepParameters::VertexProcess::LocalG1x;
  unsigned short m_reserved1 = 0;
  unsigned int m_reserved2 = 0;
  double m_reserved3 = 0.0;
}